

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O3

optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> * __thiscall
tinyusdz::MetaVariable::get_value<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
          (optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
           *__return_storage_ptr__,MetaVariable *this)

{
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *__x;
  
  __x = tinyusdz::value::Value::as<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
                  (&this->_value,false);
  if (__x == (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)0x0) {
    __return_storage_ptr__->has_value_ = false;
    *(undefined8 *)&__return_storage_ptr__->contained = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = 0;
  }
  else {
    __return_storage_ptr__->has_value_ = true;
    ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::vector
              ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
               &__return_storage_ptr__->contained,__x);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {
    if (const T *v = _value.as<T>()) {
      return *v;
    }

    return nonstd::nullopt;
  }